

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O0

int arenas_create_ctl(tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
                     size_t newlen)

{
  uint *in_RCX;
  ulong *in_R8;
  undefined8 *in_R9;
  size_t copylen;
  uint arena_ind;
  extent_hooks_t *extent_hooks;
  int ret;
  size_t local_68;
  undefined4 in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  malloc_mutex_t *in_stack_ffffffffffffffb0;
  extent_hooks_t *tsd_00;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int iVar1;
  
  malloc_mutex_lock((tsdn_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                    in_stack_ffffffffffffffb0);
  tsd_00 = &extent_hooks_default;
  if (in_R9 != (undefined8 *)0x0) {
    if (copylen != 8) {
      iVar1 = 0x16;
      goto LAB_0014e18b;
    }
    tsd_00 = (extent_hooks_t *)*in_R9;
  }
  in_stack_ffffffffffffffac =
       ctl_arena_init((tsd_t *)tsd_00,
                      (extent_hooks_t *)
                      CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  if (in_stack_ffffffffffffffac == 0xffffffff) {
    iVar1 = 0xb;
  }
  else {
    if ((in_RCX != (uint *)0x0) && (in_R8 != (ulong *)0x0)) {
      if (*in_R8 != 4) {
        if (*in_R8 < 4) {
          local_68 = *in_R8;
        }
        else {
          local_68 = 4;
        }
        memcpy(in_RCX,&stack0xffffffffffffffac,local_68);
        iVar1 = 0x16;
        goto LAB_0014e18b;
      }
      *in_RCX = in_stack_ffffffffffffffac;
    }
    iVar1 = 0;
  }
LAB_0014e18b:
  malloc_mutex_unlock((tsdn_t *)tsd_00,
                      (malloc_mutex_t *)
                      CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  return iVar1;
}

Assistant:

static int
arenas_create_ctl(tsd_t *tsd, const size_t *mib, size_t miblen,
    void *oldp, size_t *oldlenp, void *newp, size_t newlen) {
	int ret;
	extent_hooks_t *extent_hooks;
	unsigned arena_ind;

	malloc_mutex_lock(tsd_tsdn(tsd), &ctl_mtx);

	extent_hooks = (extent_hooks_t *)&extent_hooks_default;
	WRITE(extent_hooks, extent_hooks_t *);
	if ((arena_ind = ctl_arena_init(tsd, extent_hooks)) == UINT_MAX) {
		ret = EAGAIN;
		goto label_return;
	}
	READ(arena_ind, unsigned);

	ret = 0;
label_return:
	malloc_mutex_unlock(tsd_tsdn(tsd), &ctl_mtx);
	return ret;
}